

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void init_proc_7450(CPUPPCState_conflict2 *env)

{
  int nb_ways;
  undefined8 uVar1;
  CPUPPCState_conflict3 *__mptr;
  int nb_tlbs;
  undefined8 uVar2;
  
  gen_spr_ne_601(env);
  gen_spr_sdr1(env);
  gen_spr_7xx(env);
  gen_tbl(env);
  gen_spr_74xx(env);
  gen_l3_ctrl(env);
  if (((((env->spr_cb[0x3e9].name == (char *)0x0) && (env->spr[0x3e9] == 0)) &&
       (env->spr_cb[0x3e9].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      ((env->spr_cb[0x3e9].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3e9].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
     (env->spr_cb[0x3e9].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
    env->spr_cb[0x3e9].name = "L3ITCR1";
    env->spr_cb[0x3e9].uea_read = spr_noaccess;
    env->spr_cb[0x3e9].uea_write = spr_noaccess;
    env->spr_cb[0x3e9].oea_read = spr_read_generic;
    env->spr_cb[0x3e9].oea_write = spr_write_generic;
    env->spr_cb[0x3e9].hea_read = spr_read_generic;
    env->spr_cb[0x3e9].hea_write = spr_write_generic;
    env->spr_cb[0x3e9].default_value = 0;
    env->spr[0x3e9] = 0;
    if (((env->spr_cb[0x3ea].name == (char *)0x0) && (env->spr[0x3ea] == 0)) &&
       ((env->spr_cb[0x3ea].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3ea].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3ea].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3ea].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3ea].name = "L3ITCR2";
      env->spr_cb[0x3ea].uea_read = spr_noaccess;
      env->spr_cb[0x3ea].uea_write = spr_noaccess;
      env->spr_cb[0x3ea].oea_read = spr_read_generic;
      env->spr_cb[0x3ea].oea_write = spr_write_generic;
      env->spr_cb[0x3ea].hea_read = spr_read_generic;
      env->spr_cb[0x3ea].hea_write = spr_write_generic;
      env->spr_cb[0x3ea].default_value = 0;
      env->spr[0x3ea] = 0;
      if ((((env->spr_cb[0x3eb].name == (char *)0x0) && (env->spr[0x3eb] == 0)) &&
          ((env->spr_cb[0x3eb].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3eb].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3eb].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))))) &&
         (env->spr_cb[0x3eb].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
        env->spr_cb[0x3eb].name = "L3ITCR3";
        env->spr_cb[0x3eb].uea_read = spr_noaccess;
        env->spr_cb[0x3eb].uea_write = spr_noaccess;
        env->spr_cb[0x3eb].oea_read = spr_read_generic;
        env->spr_cb[0x3eb].oea_write = spr_write_generic;
        env->spr_cb[0x3eb].hea_read = spr_read_generic;
        env->spr_cb[0x3eb].hea_write = spr_write_generic;
        env->spr_cb[0x3eb].default_value = 0;
        env->spr[0x3eb] = 0;
        if ((((env->spr_cb[1000].name == (char *)0x0) && (env->spr[1000] == 0)) &&
            (env->spr_cb[1000].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
           (((env->spr_cb[1000].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[1000].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            (env->spr_cb[1000].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
          env->spr_cb[1000].name = "L3OHCR";
          env->spr_cb[1000].uea_read = spr_noaccess;
          env->spr_cb[1000].uea_write = spr_noaccess;
          env->spr_cb[1000].oea_read = spr_read_generic;
          env->spr_cb[1000].oea_write = spr_write_generic;
          env->spr_cb[1000].hea_read = spr_read_generic;
          env->spr_cb[1000].hea_write = spr_write_generic;
          env->spr_cb[1000].default_value = 0;
          env->spr[1000] = 0;
          if (((env->spr_cb[0x3a7].name == (char *)0x0) && (env->spr[0x3a7] == 0)) &&
             ((env->spr_cb[0x3a7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x3a7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x3a7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x3a7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x3a7].name = "UBAMR";
            nb_tlbs = 0xb73dbc;
            env->spr_cb[0x3a7].uea_read = spr_read_ureg;
            env->spr_cb[0x3a7].uea_write = spr_noaccess;
            env->spr_cb[0x3a7].oea_read = spr_read_ureg;
            env->spr_cb[0x3a7].oea_write = spr_noaccess;
            env->spr_cb[0x3a7].hea_read = spr_read_ureg;
            env->spr_cb[0x3a7].hea_write = spr_noaccess;
            env->spr_cb[0x3a7].default_value = 0;
            env->spr[0x3a7] = 0;
            if (((env->spr_cb[0x3f8].name == (char *)0x0) && (env->spr[0x3f8] == 0)) &&
               (((env->spr_cb[0x3f8].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x3f8].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x3f8].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                (env->spr_cb[0x3f8].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
              env->spr_cb[0x3f8].name = "LDSTCR";
              env->spr_cb[0x3f8].uea_read = spr_noaccess;
              env->spr_cb[0x3f8].uea_write = spr_noaccess;
              env->spr_cb[0x3f8].oea_read = spr_read_generic;
              env->spr_cb[0x3f8].oea_write = spr_write_generic;
              env->spr_cb[0x3f8].hea_read = spr_read_generic;
              env->spr_cb[0x3f8].hea_write = spr_write_generic;
              env->spr_cb[0x3f8].default_value = 0;
              env->spr[0x3f8] = 0;
              if (((((env->spr_cb[0x3f3].name == (char *)0x0) && (env->spr[0x3f3] == 0)) &&
                   (env->spr_cb[0x3f3].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  ((env->spr_cb[0x3f3].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x3f3].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                 (env->spr_cb[0x3f3].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
                env->spr_cb[0x3f3].name = "ICTRL";
                env->spr_cb[0x3f3].uea_read = spr_noaccess;
                env->spr_cb[0x3f3].uea_write = spr_noaccess;
                env->spr_cb[0x3f3].oea_read = spr_read_generic;
                env->spr_cb[0x3f3].oea_write = spr_write_generic;
                env->spr_cb[0x3f3].hea_read = spr_read_generic;
                env->spr_cb[0x3f3].hea_write = spr_write_generic;
                env->spr_cb[0x3f3].default_value = 0;
                env->spr[0x3f3] = 0;
                if (((env->spr_cb[0x3f7].name == (char *)0x0) && (env->spr[0x3f7] == 0)) &&
                   ((env->spr_cb[0x3f7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                    (((env->spr_cb[0x3f7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                      (env->spr_cb[0x3f7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                     && (env->spr_cb[0x3f7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)
                     ))))) {
                  env->spr_cb[0x3f7].name = "MSSSR0";
                  env->spr_cb[0x3f7].uea_read = spr_noaccess;
                  env->spr_cb[0x3f7].uea_write = spr_noaccess;
                  env->spr_cb[0x3f7].oea_read = spr_read_generic;
                  env->spr_cb[0x3f7].oea_write = spr_write_generic;
                  env->spr_cb[0x3f7].hea_read = spr_read_generic;
                  env->spr_cb[0x3f7].hea_write = spr_write_generic;
                  env->spr_cb[0x3f7].default_value = 0;
                  env->spr[0x3f7] = 0;
                  if (((env->spr_cb[0x3b1].name == (char *)0x0) && (env->spr[0x3b1] == 0)) &&
                     (((env->spr_cb[0x3b1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                       ((env->spr_cb[0x3b1].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0
                        && (env->spr_cb[0x3b1].uea_read ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                      (env->spr_cb[0x3b1].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))
                     ) {
                    env->spr_cb[0x3b1].name = "PMC5";
                    env->spr_cb[0x3b1].uea_read = spr_noaccess;
                    env->spr_cb[0x3b1].uea_write = spr_noaccess;
                    env->spr_cb[0x3b1].oea_read = spr_read_generic;
                    env->spr_cb[0x3b1].oea_write = spr_write_generic;
                    env->spr_cb[0x3b1].hea_read = spr_read_generic;
                    env->spr_cb[0x3b1].hea_write = spr_write_generic;
                    env->spr_cb[0x3b1].default_value = 0;
                    env->spr[0x3b1] = 0;
                    if ((((env->spr_cb[0x3a1].name == (char *)0x0) && (env->spr[0x3a1] == 0)) &&
                        (env->spr_cb[0x3a1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                       && (((env->spr_cb[0x3a1].oea_write ==
                             (_func_void_DisasContext_ptr_int_int *)0x0 &&
                            (env->spr_cb[0x3a1].uea_read ==
                             (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                           (env->spr_cb[0x3a1].uea_write ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                      env->spr_cb[0x3a1].name = "UPMC5";
                      env->spr_cb[0x3a1].uea_read = spr_read_ureg;
                      env->spr_cb[0x3a1].uea_write = spr_noaccess;
                      env->spr_cb[0x3a1].oea_read = spr_read_ureg;
                      env->spr_cb[0x3a1].oea_write = spr_noaccess;
                      env->spr_cb[0x3a1].hea_read = spr_read_ureg;
                      env->spr_cb[0x3a1].hea_write = spr_noaccess;
                      env->spr_cb[0x3a1].default_value = 0;
                      env->spr[0x3a1] = 0;
                      if (((env->spr_cb[0x3b2].name == (char *)0x0) && (env->spr[0x3b2] == 0)) &&
                         ((env->spr_cb[0x3b2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0
                          && (((env->spr_cb[0x3b2].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x3b2].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                              (env->spr_cb[0x3b2].uea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
                        env->spr_cb[0x3b2].name = "PMC6";
                        env->spr_cb[0x3b2].uea_read = spr_noaccess;
                        env->spr_cb[0x3b2].uea_write = spr_noaccess;
                        env->spr_cb[0x3b2].oea_read = spr_read_generic;
                        env->spr_cb[0x3b2].oea_write = spr_write_generic;
                        env->spr_cb[0x3b2].hea_read = spr_read_generic;
                        env->spr_cb[0x3b2].hea_write = spr_write_generic;
                        env->spr_cb[0x3b2].default_value = 0;
                        env->spr[0x3b2] = 0;
                        if (((env->spr_cb[0x3a2].name == (char *)0x0) && (env->spr[0x3a2] == 0)) &&
                           (((env->spr_cb[0x3a2].oea_read ==
                              (_func_void_DisasContext_ptr_int_int *)0x0 &&
                             ((env->spr_cb[0x3a2].oea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0 &&
                              (env->spr_cb[0x3a2].uea_read ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                            (env->spr_cb[0x3a2].uea_write ==
                             (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                          env->spr_cb[0x3a2].name = "UPMC6";
                          env->spr_cb[0x3a2].uea_read = spr_read_ureg;
                          env->spr_cb[0x3a2].uea_write = spr_noaccess;
                          env->spr_cb[0x3a2].oea_read = spr_read_ureg;
                          env->spr_cb[0x3a2].oea_write = spr_noaccess;
                          env->spr_cb[0x3a2].hea_read = spr_read_ureg;
                          env->spr_cb[0x3a2].hea_write = spr_noaccess;
                          env->spr_cb[0x3a2].default_value = 0;
                          env->spr[0x3a2] = 0;
                          gen_low_BATs(env);
                          gen_74xx_soft_tlb(env,nb_tlbs,nb_ways);
                          env->excp_vectors[0x40] = 0x100;
                          env->excp_vectors[1] = 0x200;
                          env->excp_vectors[2] = 0x300;
                          env->excp_vectors[3] = 0x400;
                          env->excp_vectors[4] = 0x500;
                          env->excp_vectors[5] = 0x600;
                          env->excp_vectors[6] = 0x700;
                          env->excp_vectors[7] = 0x800;
                          env->excp_vectors[10] = 0x900;
                          env->excp_vectors[8] = 0xc00;
                          env->excp_vectors[0x44] = 0xd00;
                          env->excp_vectors[0x55] = 0xf00;
                          env->excp_vectors[0x49] = 0xf20;
                          env->excp_vectors[0x4e] = 0x1000;
                          env->excp_vectors[0x4f] = 0x1100;
                          env->excp_vectors[0x50] = 0x1200;
                          env->excp_vectors[0x53] = 0x1300;
                          env->excp_vectors[0x54] = 0x1400;
                          env->excp_vectors[0x57] = 0x1600;
                          env->hreset_vector = 0x100;
                          env->dcache_line_size = 0x20;
                          env->icache_line_size = 0x20;
                          ppc6xx_irq_init_ppc64
                                    ((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
                          return;
                        }
                        uVar2 = 0x3a2;
                        uVar1 = 0x3a2;
                      }
                      else {
                        uVar2 = 0x3b2;
                        uVar1 = 0x3b2;
                      }
                    }
                    else {
                      uVar2 = 0x3a1;
                      uVar1 = 0x3a1;
                    }
                  }
                  else {
                    uVar2 = 0x3b1;
                    uVar1 = 0x3b1;
                  }
                }
                else {
                  uVar2 = 0x3f7;
                  uVar1 = 0x3f7;
                }
              }
              else {
                uVar2 = 0x3f3;
                uVar1 = 0x3f3;
              }
            }
            else {
              uVar2 = 0x3f8;
              uVar1 = 0x3f8;
            }
          }
          else {
            uVar2 = 0x3a7;
            uVar1 = 0x3a7;
          }
        }
        else {
          uVar2 = 1000;
          uVar1 = 1000;
        }
      }
      else {
        uVar2 = 0x3eb;
        uVar1 = 0x3eb;
      }
    }
    else {
      uVar2 = 0x3ea;
      uVar1 = 0x3ea;
    }
  }
  else {
    uVar2 = 0x3e9;
    uVar1 = 0x3e9;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void init_proc_7450(CPUPPCState *env)
{
    gen_spr_ne_601(env);
    gen_spr_sdr1(env);
    gen_spr_7xx(env);
    /* Time base */
    gen_tbl(env);
    /* 74xx specific SPR */
    gen_spr_74xx(env);
    /* Level 3 cache control */
    gen_l3_ctrl(env);
    /* L3ITCR1 */
    /* XXX : not implemented */
    spr_register(env, SPR_L3ITCR1, "L3ITCR1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* L3ITCR2 */
    /* XXX : not implemented */
    spr_register(env, SPR_L3ITCR2, "L3ITCR2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* L3ITCR3 */
    /* XXX : not implemented */
    spr_register(env, SPR_L3ITCR3, "L3ITCR3",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* L3OHCR */
    /* XXX : not implemented */
    spr_register(env, SPR_L3OHCR, "L3OHCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_UBAMR, "UBAMR",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* LDSTCR */
    /* XXX : not implemented */
    spr_register(env, SPR_LDSTCR, "LDSTCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* ICTRL */
    /* XXX : not implemented */
    spr_register(env, SPR_ICTRL, "ICTRL",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* MSSSR0 */
    /* XXX : not implemented */
    spr_register(env, SPR_MSSSR0, "MSSSR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* PMC */
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC5, "PMC5",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC5, "UPMC5",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC6, "PMC6",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC6, "UPMC6",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* Memory management */
    gen_low_BATs(env);
    gen_74xx_soft_tlb(env, 128, 2);
    init_excp_7450(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc6xx_irq_init(env_archcpu(env));
}